

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O3

void __thiscall Reset_resetRemoveResetValue_Test::TestBody(Reset_resetRemoveResetValue_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  ResetPtr r;
  AssertHelper aAStack_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Reset::create();
  libcellml::Reset::resetValue_abi_cxx11_();
  pcVar3 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            (local_30,"\"\"","r->resetValue()",(char (*) [1])0x113bcd,&local_50);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_28.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0x265,pcVar3);
    testing::internal::AssertHelper::operator=(aAStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(aAStack_58);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_50._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"some reset sort of math","");
  libcellml::Reset::setResetValue(local_20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  libcellml::Reset::resetValue_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
            (local_30,"\"some reset sort of math\"","r->resetValue()",
             (char (*) [24])"some reset sort of math",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0x269,pcVar3);
    testing::internal::AssertHelper::operator=(aAStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(aAStack_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Reset::removeResetValue();
  libcellml::Reset::resetValue_abi_cxx11_();
  pcVar3 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            (local_30,"\"\"","r->resetValue()",(char (*) [1])0x113bcd,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_28.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/reset/reset.cpp"
               ,0x26d,pcVar3);
    testing::internal::AssertHelper::operator=(aAStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(aAStack_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Reset, resetRemoveResetValue)
{
    libcellml::ResetPtr r = libcellml::Reset::create();

    EXPECT_EQ("", r->resetValue());

    r->setResetValue("some reset sort of math");

    EXPECT_EQ("some reset sort of math", r->resetValue());

    r->removeResetValue();

    EXPECT_EQ("", r->resetValue());
}